

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  char *pcVar2;
  CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *this;
  mapped_type pSVar3;
  mapped_type *ppSVar4;
  ostream *poVar5;
  DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *pDVar6;
  istream *piVar7;
  size_type sVar8;
  void *pvVar9;
  reference ppMVar10;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Sensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Sensor_*>_>_>
  local_860;
  vector<Measurement_*,_std::allocator<Measurement_*>_> local_830;
  Matrix<double,__1,_1,_0,__1,_1> local_818;
  vector<Measurement_*,_std::allocator<Measurement_*>_> local_808;
  Matrix<double,__1,_1,_0,__1,_1> local_7f0;
  Measurement **local_7e0;
  Measurement *local_7d8;
  Measurement *m_1;
  Measurement **local_7c8;
  int local_7bc;
  iterator iStack_7b8;
  int i;
  iterator it;
  UnscentedKalmanFilter ukf;
  istringstream iss;
  Measurement *local_568;
  Measurement *m;
  string line;
  undefined1 local_540 [8];
  MeasurementContainer measurements;
  MeasurementFactory *mf;
  SensorContainer sensors;
  string local_4e8 [32];
  mapped_type local_4c8;
  Sensor *lidar;
  string local_4b8 [32];
  mapped_type local_498;
  Sensor *radar;
  undefined1 local_470 [8];
  VectorXd lidar_noise;
  undefined1 local_440 [8];
  VectorXd radar_noise;
  ofstream local_420 [8];
  ofstream out_file;
  ifstream local_220 [8];
  ifstream in_file;
  char **argv_local;
  int argc_local;
  
  parse_arguments(argc,argv,&ukf_parameters);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  std::ifstream::ifstream(local_220,pcVar2,_S_in);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  std::ofstream::ofstream(local_420,pcVar2,_S_out);
  check_and_open_files
            (local_220,(string *)in_filename_abi_cxx11_,local_420,(string *)out_filename_abi_cxx11_)
  ;
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_440,3);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator<<
            ((CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
             &lidar_noise.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
              m_rows,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_440,&std_radr);
  this = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                   ((CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                    &lidar_noise.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                     m_storage.m_rows,&std_radphi);
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_(this,&std_radrd);
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::~CommaInitializer
            ((CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
             &lidar_noise.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
              m_rows);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_470,2);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator<<
            ((CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&radar,
             (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_470,&std_laspy);
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
            ((CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&radar,&std_laspx);
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::~CommaInitializer
            ((CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&radar);
  pSVar3 = (mapped_type)operator_new(0x48);
  lidar._6_1_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_4b8,"R",(allocator *)((long)&lidar + 7));
  RadarSensor::RadarSensor
            ((RadarSensor *)pSVar3,(string *)local_4b8,(VectorXd *)local_440,ukf_parameters.debug);
  lidar._6_1_ = 0;
  std::__cxx11::string::~string(local_4b8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&lidar + 7));
  local_498 = pSVar3;
  pSVar3 = (mapped_type)operator_new(0x48);
  sensors._M_t._M_impl.super__Rb_tree_header._M_node_count._6_1_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_4e8,"L",
             (allocator *)((long)&sensors._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
  LidarSensor::LidarSensor
            ((LidarSensor *)pSVar3,(string *)local_4e8,(VectorXd *)local_470,ukf_parameters.debug);
  sensors._M_t._M_impl.super__Rb_tree_header._M_node_count._6_1_ = 0;
  std::__cxx11::string::~string(local_4e8);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&sensors._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
  local_4c8 = pSVar3;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Sensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Sensor_*>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Sensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Sensor_*>_>_>
         *)&mf);
  std::operator<<((ostream *)&std::cout,"Sensors: ");
  pSVar3 = local_4c8;
  if ((use_lidar & 1U) != 0) {
    ppSVar4 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Sensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Sensor_*>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Sensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Sensor_*>_>_>
                            *)&mf,&local_4c8->name_);
    *ppSVar4 = pSVar3;
    std::operator<<((ostream *)&std::cout,"Lidar ");
  }
  pSVar3 = local_498;
  if ((use_radar & 1U) != 0) {
    ppSVar4 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Sensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Sensor_*>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Sensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Sensor_*>_>_>
                            *)&mf,&local_498->name_);
    *ppSVar4 = pSVar3;
    std::operator<<((ostream *)&std::cout,"Radar");
  }
  std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  if (1 < ukf_parameters.debug) {
    if ((use_radar & 1U) != 0) {
      poVar5 = std::operator<<((ostream *)&std::cout,"Radar covariance:\n");
      pDVar6 = (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)Sensor::GetR(local_498);
      poVar5 = Eigen::operator<<(poVar5,pDVar6);
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    }
    if ((use_lidar & 1U) != 0) {
      poVar5 = std::operator<<((ostream *)&std::cout,"Lidar covariance:\n");
      pDVar6 = (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)Sensor::GetR(local_4c8);
      poVar5 = Eigen::operator<<(poVar5,pDVar6);
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    }
  }
  measurements.super__Vector_base<Measurement_*,_std::allocator<Measurement_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)MeasurementFactory::GetInstance();
  std::vector<Measurement_*,_std::allocator<Measurement_*>_>::vector
            ((vector<Measurement_*,_std::allocator<Measurement_*>_> *)local_540);
  std::__cxx11::string::string((string *)&m);
  while( true ) {
    piVar7 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)local_220,(string *)&m);
    bVar1 = std::ios::operator_cast_to_bool((ios *)(piVar7 + *(long *)(*(long *)piVar7 + -0x18)));
    if (!bVar1 || n_meas == 0) break;
    std::__cxx11::istringstream::istringstream
              ((istringstream *)
               &ukf.Xsig_pred_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                m_storage.m_cols,(string *)&m,_S_in);
    local_568 = MeasurementFactory::CreateMeasurement
                          ((MeasurementFactory *)
                           measurements.
                           super__Vector_base<Measurement_*,_std::allocator<Measurement_*>_>._M_impl
                           .super__Vector_impl_data._M_end_of_storage,
                           (istringstream *)
                           &ukf.Xsig_pred_.
                            super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                            m_storage.m_cols,(SensorContainer *)&mf);
    if (local_568 != (Measurement *)0x0) {
      std::vector<Measurement_*,_std::allocator<Measurement_*>_>::push_back
                ((vector<Measurement_*,_std::allocator<Measurement_*>_> *)local_540,&local_568);
      n_meas = n_meas + -1;
    }
    std::__cxx11::istringstream::~istringstream
              ((istringstream *)
               &ukf.Xsig_pred_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                m_storage.m_cols);
  }
  poVar5 = std::operator<<((ostream *)&std::cout,"Number of measurements: ");
  sVar8 = std::vector<Measurement_*,_std::allocator<Measurement_*>_>::size
                    ((vector<Measurement_*,_std::allocator<Measurement_*>_> *)local_540);
  pvVar9 = (void *)std::ostream::operator<<(poVar5,sVar8);
  std::ostream::operator<<(pvVar9,std::endl<char,std::char_traits<char>>);
  std::ifstream::close();
  UnscentedKalmanFilter::UnscentedKalmanFilter((UnscentedKalmanFilter *)&it,&ukf_parameters);
  __gnu_cxx::
  __normal_iterator<Measurement_**,_std::vector<Measurement_*,_std::allocator<Measurement_*>_>_>::
  __normal_iterator(&stack0xfffffffffffff848);
  local_7c8 = (Measurement **)
              std::vector<Measurement_*,_std::allocator<Measurement_*>_>::begin
                        ((vector<Measurement_*,_std::allocator<Measurement_*>_> *)local_540);
  local_7bc = 0;
  iStack_7b8 = (iterator)local_7c8;
  while( true ) {
    m_1 = (Measurement *)
          std::vector<Measurement_*,_std::allocator<Measurement_*>_>::end
                    ((vector<Measurement_*,_std::allocator<Measurement_*>_> *)local_540);
    bVar1 = __gnu_cxx::operator!=
                      (&stack0xfffffffffffff848,
                       (__normal_iterator<Measurement_**,_std::vector<Measurement_*,_std::allocator<Measurement_*>_>_>
                        *)&m_1);
    if (!bVar1) break;
    ppMVar10 = __gnu_cxx::
               __normal_iterator<Measurement_**,_std::vector<Measurement_*,_std::allocator<Measurement_*>_>_>
               ::operator*(&stack0xfffffffffffff848);
    local_7d8 = *ppMVar10;
    if (ukf_parameters.debug != 0) {
      poVar5 = std::operator<<((ostream *)&std::cout,"--- START MEASUREMENT: ");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_7bc);
      poVar5 = std::operator<<(poVar5," -------------------------------");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    }
    UnscentedKalmanFilter::ProcessMeasurement((UnscentedKalmanFilter *)&it,local_7d8);
    if ((ukf.lambda_._0_1_ & 1) != 0) {
      poVar5 = std::operator<<((ostream *)&std::cout,"Filter restarted at measurement ");
      pvVar9 = (void *)std::ostream::operator<<(poVar5,local_7bc);
      std::ostream::operator<<(pvVar9,std::endl<char,std::char_traits<char>>);
    }
    operator<<((ostream *)local_420,local_7d8);
    local_7e0 = (Measurement **)
                __gnu_cxx::
                __normal_iterator<Measurement_**,_std::vector<Measurement_*,_std::allocator<Measurement_*>_>_>
                ::operator++(&stack0xfffffffffffff848,0);
    local_7bc = local_7bc + 1;
  }
  std::ofstream::close();
  poVar5 = std::operator<<((ostream *)&std::cout,"Accuracy - RMSE:");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  std::vector<Measurement_*,_std::allocator<Measurement_*>_>::vector
            (&local_808,(vector<Measurement_*,_std::allocator<Measurement_*>_> *)local_540);
  Tools::CalculateRMSE((Tools *)&local_7f0,&local_808);
  poVar5 = Eigen::operator<<(poVar5,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_7f0
                            );
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix(&local_7f0);
  std::vector<Measurement_*,_std::allocator<Measurement_*>_>::~vector(&local_808);
  poVar5 = std::operator<<((ostream *)&std::cout,"Consistency - percentage above Chi^2(0.050):");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  std::vector<Measurement_*,_std::allocator<Measurement_*>_>::vector
            (&local_830,(vector<Measurement_*,_std::allocator<Measurement_*>_> *)local_540);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Sensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Sensor_*>_>_>
  ::map(&local_860,
        (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Sensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Sensor_*>_>_>
         *)&mf);
  Tools::CheckConsistency((Tools *)&local_818,&local_830,&local_860);
  poVar5 = Eigen::operator<<(poVar5,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_818
                            );
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix(&local_818);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Sensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Sensor_*>_>_>
  ::~map(&local_860);
  std::vector<Measurement_*,_std::allocator<Measurement_*>_>::~vector(&local_830);
  poVar5 = std::operator<<((ostream *)&std::cout,"Done!");
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  UnscentedKalmanFilter::~UnscentedKalmanFilter((UnscentedKalmanFilter *)&it);
  std::__cxx11::string::~string((string *)&m);
  std::vector<Measurement_*,_std::allocator<Measurement_*>_>::~vector
            ((vector<Measurement_*,_std::allocator<Measurement_*>_> *)local_540);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Sensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Sensor_*>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Sensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Sensor_*>_>_>
          *)&mf);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_470);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_440);
  std::ofstream::~ofstream(local_420);
  std::ifstream::~ifstream(local_220);
  return 0;
}

Assistant:

int main(int argc, char* argv[]) {

  parse_arguments(argc, argv, ukf_parameters);
  ifstream in_file(in_filename.c_str(), ifstream::in);
  ofstream out_file(out_filename.c_str(), ofstream::out);
  check_and_open_files(in_file, in_filename, out_file, out_filename);

  // Initialize covariance matrices of sensors
  VectorXd radar_noise(3);
  radar_noise << std_radr, std_radphi, std_radrd;
  VectorXd lidar_noise(2);
  lidar_noise << std_laspy, std_laspx;

  // Create sensor instances
  Sensor *radar = new RadarSensor("R", radar_noise, ukf_parameters.debug); 
  Sensor *lidar = new LidarSensor("L", lidar_noise, ukf_parameters.debug); 

  // Create sensor collection
  //
  // If a sensor is flagged out, its not included in sensor collection
  // and all measurements of the sensor are discarded.
  SensorContainer sensors;
  std::cout << "Sensors: ";
  if (use_lidar) {
      sensors[lidar->name_] = lidar;
      std::cout << "Lidar ";
  }
  if (use_radar) {
      sensors[radar->name_] = radar;
      std::cout << "Radar";  
  }
  std::cout << std::endl;

  if (ukf_parameters.debug>1) {
      if (use_radar) cout << "Radar covariance:\n" << radar->GetR() << endl;  
      if (use_lidar) cout << "Lidar covariance:\n" << lidar->GetR() << endl;  
  }

  // Get measurement factory
  MeasurementFactory* mf = MeasurementFactory::GetInstance();

  MeasurementContainer measurements;
  string line;

  // Read input file and fill measurement container
  while (getline(in_file, line) && n_meas != 0) {
    Measurement *m;
    istringstream iss(line);

    // Create measurement from input line, and store it to container
    // measurement is only created, if corresponding sensor is present in sensor collection
    m = mf->CreateMeasurement(iss, sensors);
    if (m != 0) {
        measurements.push_back(m);
        n_meas--;
    }
  }
  std::cout << "Number of measurements: " << measurements.size() << std::endl;
  in_file.close();

  // Create a filter instance
  UnscentedKalmanFilter ukf(ukf_parameters);

  // Run measurement through the filter and get estimations
  MeasurementContainer::iterator it;
  int i;
  for(it=measurements.begin(), i=0; it!=measurements.end(); it++, i++) {

    Measurement *m = *it;
    if (ukf_parameters.debug)
        std::cout << "--- START MEASUREMENT: " << i << " -------------------------------" << std::endl;

    ukf.ProcessMeasurement(m);

    if (ukf.restart_)
        std::cout << "Filter restarted at measurement " << i << std::endl;

    out_file << *m; // output estimate 
  }
  out_file.close();


  // Calculate accuracy and check consistency
  // - print out results
  cout << "Accuracy - RMSE:" << endl << Tools::CalculateRMSE(measurements) << endl;
  cout << "Consistency - percentage above Chi^2(0.050):" << endl << Tools::CheckConsistency(measurements, sensors) << endl;
  
  cout << "Done!" << endl;
  return 0;
}